

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int nghttp2_session_on_window_update_received(nghttp2_session *session,nghttp2_frame *frame)

{
  int32_t stream_id;
  uint uVar1;
  int iVar2;
  nghttp2_stream *stream;
  int iVar3;
  char *reason;
  
  stream_id = (frame->hd).stream_id;
  if (stream_id == 0) {
    uVar1 = (frame->rst_stream).error_code;
    if (uVar1 != 0) {
      if (session->remote_window_size <= (int)(uVar1 ^ 0x7fffffff)) {
        session->remote_window_size = session->remote_window_size + uVar1;
LAB_0044b608:
        iVar2 = session_call_on_frame_received(session,frame);
        return iVar2;
      }
      iVar2 = -0x20c;
      reason = (char *)0x0;
      goto LAB_0044b663;
    }
LAB_0044b651:
    reason = "WINDOW_UPDATE: window_size_increment == 0";
  }
  else {
    iVar2 = session_detect_idle_stream(session,stream_id);
    if (iVar2 == 0) {
      stream = nghttp2_session_get_stream(session,stream_id);
      if (stream == (nghttp2_stream *)0x0) {
        return 0;
      }
      if ((stream->state != NGHTTP2_STREAM_RESERVED) ||
         ((stream->stream_id != 0 &&
          ((session->server == '\0') == (bool)((byte)stream->stream_id & 1))))) {
        uVar1 = (frame->priority).pri_spec.stream_id;
        if (uVar1 != 0) {
          iVar2 = stream->remote_window_size;
          if ((int)(uVar1 ^ 0x7fffffff) < iVar2) {
            iVar2 = session_handle_invalid_stream(session,frame,-0x20c);
            return iVar2;
          }
          iVar3 = iVar2 + uVar1;
          stream->remote_window_size = iVar3;
          if (((iVar3 != 0 && SCARRY4(iVar2,uVar1) == iVar3 < 0) &&
              (iVar2 = nghttp2_stream_check_deferred_by_flow_control(stream), iVar2 != 0)) &&
             (iVar2 = session_resume_deferred_stream_item(session,stream,'\x04'), iVar2 < -900)) {
            return iVar2;
          }
          goto LAB_0044b608;
        }
        goto LAB_0044b651;
      }
      reason = "WINDOW_UPADATE to reserved stream";
    }
    else {
      reason = "WINDOW_UPDATE to idle stream";
    }
  }
  iVar2 = -0x1f9;
LAB_0044b663:
  iVar2 = session_handle_invalid_connection(session,frame,iVar2,reason);
  return iVar2;
}

Assistant:

int nghttp2_session_on_window_update_received(nghttp2_session *session,
                                              nghttp2_frame *frame) {
  if (frame->hd.stream_id == 0) {
    return session_on_connection_window_update_received(session, frame);
  } else {
    return session_on_stream_window_update_received(session, frame);
  }
}